

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

void __thiscall
wasm::Fuzzer::run(Fuzzer *this,uint64_t seed,uint64_t *latticeElementSeed,string *funcName)

{
  long lVar1;
  ostream *poVar2;
  pointer __s;
  result_type rVar3;
  char *pcVar4;
  Function *pFVar5;
  uint64_t uVar6;
  value_type *__val;
  size_t i;
  ulong uVar7;
  Name NVar8;
  undefined1 local_1178 [8];
  RandEngine getRand;
  TranslateToFuzzReader reader;
  Module testModule;
  vector<char,_std::allocator<char>_> local_48;
  
  lVar1 = 1;
  uVar6 = seed;
  do {
    uVar6 = (uVar6 >> 0x3e ^ uVar6) * 0x5851f42d4c957f2d + lVar1;
    getRand._M_x[lVar1 + -1] = uVar6;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x138);
  getRand._M_x[0x137] = 0x138;
  local_1178 = (undefined1  [8])seed;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running with seed ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  __s = (pointer)operator_new(0x1000);
  uVar7 = 0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = __s;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x1000;
  memset(__s,0,0x1000);
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = __s + 0x1000;
  do {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_1178);
    *(result_type *)(__s + uVar7) = rVar3;
    uVar7 = uVar7 + 8;
  } while (uVar7 < 0x1000);
  Module::Module((Module *)&reader.nesting);
  TranslateToFuzzReader::TranslateToFuzzReader
            ((TranslateToFuzzReader *)&getRand._M_p,(Module *)&reader.nesting,&local_48,false);
  TranslateToFuzzReader::build((TranslateToFuzzReader *)&getRand._M_p);
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Generated test module: \n",0x18);
    std::operator<<((ostream *)&std::cout,(Module *)&reader.nesting);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  if (funcName == (string *)0x0 || latticeElementSeed == (uint64_t *)0x0) {
    if (testModule.exports.
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)testModule.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pFVar5 = (Function *)
                 ((testModule.exports.
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (*(char **)&((Name *)((long)&pFVar5->super_Importable + 0x20))->super_IString ==
            (char *)0x0) {
          rVar3 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                *)local_1178);
          runOnFunction(this,pFVar5,rVar3);
        }
        testModule.exports.
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             testModule.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      } while (testModule.exports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage !=
               (pointer)testModule.functions.
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    pcVar4 = (char *)wasm::IString::interned
                               (funcName->_M_string_length,(funcName->_M_dataplus)._M_p,0);
    NVar8.super_IString.str._M_str = pcVar4;
    NVar8.super_IString.str._M_len = (size_t)&reader.nesting;
    pFVar5 = (Function *)wasm::Module::getFunction(NVar8);
    runOnFunction(this,pFVar5,*latticeElementSeed);
  }
  TranslateToFuzzReader::~TranslateToFuzzReader((TranslateToFuzzReader *)&getRand._M_p);
  Module::~Module((Module *)&reader.nesting);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run(uint64_t seed,
           uint64_t* latticeElementSeed = nullptr,
           std::string* funcName = nullptr) {
    RandEngine getRand(seed);
    std::cout << "Running with seed " << seed << "\n";

    // 4kb of random bytes should be enough for anyone!
    std::vector<char> bytes(4096);
    for (size_t i = 0; i < bytes.size(); i += sizeof(uint64_t)) {
      *(uint64_t*)(bytes.data() + i) = getRand();
    }

    Module testModule;
    TranslateToFuzzReader reader(testModule, std::move(bytes));
    reader.build();

    if (verbose) {
      std::cout << "Generated test module: \n";
      std::cout << testModule;
      std::cout << "\n";
    }

    // If a specific function and lattice element seed is specified, only run
    // that.
    if (latticeElementSeed && funcName) {
      runOnFunction(testModule.getFunction(*funcName), *latticeElementSeed);
      return;
    }

    ModuleUtils::iterDefinedFunctions(testModule, [&](Function* func) {
      uint64_t funcSeed = getRand();
      runOnFunction(func, funcSeed);
    });
  }